

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcDebugSetBreakFunction(void *context,_func_uint_void_ptr_uint *callback)

{
  _func_uint_void_ptr_uint *callback_local;
  void *context_local;
  
  if (NULLC::executorX86 == (ExecutorX86 *)0x0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    context_local._7_1_ = '\0';
  }
  else {
    ExecutorX86::SetBreakFunction(NULLC::executorX86,context,callback);
    if (NULLC::executorRegVm == (ExecutorRegVm *)0x0) {
      NULLC::nullcLastError = "ERROR: NULLC is not initialized";
      context_local._7_1_ = '\0';
    }
    else {
      ExecutorRegVm::SetBreakFunction(NULLC::executorRegVm,context,callback);
      context_local._7_1_ = '\x01';
    }
  }
  return context_local._7_1_;
}

Assistant:

nullres nullcDebugSetBreakFunction(void *context, unsigned (*callback)(void*, unsigned))
{
	using namespace NULLC;

#ifdef NULLC_BUILD_X86_JIT
	if(!executorX86)
	{
		nullcLastError = "ERROR: NULLC is not initialized";
		return false;
	}
	executorX86->SetBreakFunction(context, callback);
#endif

	if(!executorRegVm)
	{
		nullcLastError = "ERROR: NULLC is not initialized";
		return false;
	}
	executorRegVm->SetBreakFunction(context, callback);

	return true;
}